

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_generate_luts.c
# Opt level: O0

void dump_array16(int *array,int size)

{
  int local_18;
  int i;
  int size_local;
  int *array_local;
  
  for (local_18 = 0; local_18 < size + -1; local_18 = local_18 + 1) {
    printf("0x%04x, ",(ulong)(uint)array[local_18]);
    if ((local_18 + 1U & 7) == 0) {
      printf("\n  ");
    }
  }
  printf("0x%04x\n};\n\n",(ulong)(uint)array[size + -1]);
  return;
}

Assistant:

static void dump_array16(int array[],int size){
	int i;
	--size;
	for (i = 0; i < size; ++i) {
		printf("0x%04x, ", array[i]);
		if(!((i+1)&0x7))
			printf("\n  ");
	}
	printf("0x%04x\n};\n\n", array[size]);
}